

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O2

int siftBackwardProb(DdManager *table,Move *moves,int size,double temp)

{
  int iVar1;
  Move *pMVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  iVar3 = size;
  for (pMVar2 = moves; pMVar2 != (Move *)0x0; pMVar2 = pMVar2->next) {
    if (pMVar2->size < iVar3) {
      iVar3 = pMVar2->size;
    }
  }
  if (iVar3 == size) {
    dVar4 = random_generator();
    dVar5 = exp((double)((ulong)(double)(table->keys - (size + table->isolated)) |
                        (ulong)DAT_006aed10) / temp);
    if (dVar4 < dVar5) {
      return 1;
    }
  }
  iVar1 = table->keys - table->isolated;
  while( true ) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (iVar1 == iVar3) break;
    iVar1 = cuddSwapInPlace(table,moves->x,moves->y);
    if (iVar1 == 0) {
      return 0;
    }
    moves = moves->next;
  }
  return 1;
}

Assistant:

static int
siftBackwardProb(
  DdManager * table,
  Move * moves,
  int  size,
  double  temp)
{
    Move   *move;
    int    res;
    int    best_size = size;
    double coin, threshold;

    /* Look for best size during the last sifting */
    for (move = moves; move != NULL; move = move->next) {
        if (move->size < best_size) {
            best_size = move->size;
        }
    }
    
    /* If best_size equals size, the last sifting did not produce any
    ** improvement. We now toss a coin to decide whether to retain
    ** this change or not.
    */
    if (best_size == size) {
        coin = random_generator();
#ifdef DD_STATS
        tosses++;
#endif
        threshold = exp(-((double)(table->keys - table->isolated - size))/temp);
        if (coin < threshold) {
#ifdef DD_STATS
            acceptances++;
#endif
            return(1);
        }
    }

    /* Either there was improvement, or we have decided not to
    ** accept the uphill move. Go to best position.
    */
    res = table->keys - table->isolated;
    for (move = moves; move != NULL; move = move->next) {
        if (res == best_size) return(1);
        res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
        if (!res) return(0);
    }

    return(1);

}